

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerConvNum(Lowerer *this,Instr *instrLoad,bool noMathFastPath)

{
  bool bVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar3;
  RegOpnd *this_00;
  LabelInstr *instr_00;
  LabelInstr *labelHelper;
  bool didTest;
  Instr *instr;
  LabelInstr *labelDone;
  RegOpnd *src1;
  bool isNotInt;
  bool isInt;
  bool noMathFastPath_local;
  Instr *instrLoad_local;
  Lowerer *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,OtherFastPathPhase,sourceContextId,functionId);
  if ((!bVar1) && (!noMathFastPath)) {
    pOVar3 = IR::Instr::GetSrc1(instrLoad);
    bVar1 = IR::Opnd::IsRegOpnd(pOVar3);
    if (bVar1) {
      src1._5_1_ = false;
      pOVar3 = IR::Instr::GetSrc1(instrLoad);
      this_00 = IR::Opnd::AsRegOpnd(pOVar3);
      instr = (Instr *)0x0;
      bVar1 = IR::Opnd::IsTaggedInt(&this_00->super_Opnd);
      if (!bVar1) {
        src1._5_1_ = IR::Opnd::IsNotInt(&this_00->super_Opnd);
      }
      if (src1._5_1_ == false) {
        pOVar3 = IR::Instr::GetDst(instrLoad);
        InsertMove(pOVar3,&this_00->super_Opnd,instrLoad,true);
        if (!bVar1) {
          instr = &IR::LabelInstr::New(Label,this->m_func,false)->super_Instr;
          bVar2 = LowererMD::GenerateObjectTest
                            (&this->m_lowererMD,&this_00->super_Opnd,instrLoad,(LabelInstr *)instr,
                             false);
          if (bVar2) {
            instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
            IR::Instr::InsertBefore(instrLoad,&instr_00->super_Instr);
          }
        }
      }
      if (!bVar1) {
        if (instr != (Instr *)0x0) {
          IR::Instr::InsertAfter(instrLoad,instr);
        }
        LowerUnaryHelperMemWithTemp2
                  (this,instrLoad,HelperOp_ConvNumber_Full,HelperOp_ConvNumberInPlace);
        return;
      }
      IR::Instr::Remove(instrLoad);
      return;
    }
  }
  LowerUnaryHelperMemWithTemp2(this,instrLoad,HelperOp_ConvNumber_Full,HelperOp_ConvNumberInPlace);
  return;
}

Assistant:

void
Lowerer::LowerConvNum(IR::Instr *instrLoad, bool noMathFastPath)
{
    if (PHASE_OFF(Js::OtherFastPathPhase, this->m_func) || noMathFastPath || !instrLoad->GetSrc1()->IsRegOpnd())
    {
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
        return;
    }

    //      MOV dst, src1
    //      TEST src1, 1
    //      JNE $done
    //      call ToNumber
    //$done:

    bool isInt = false;
    bool isNotInt = false;
    IR::RegOpnd *src1 = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelDone = NULL;
    IR::Instr *instr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }
    if (!isNotInt)
    {
        //      MOV dst, src1

        instr = Lowerer::InsertMove(instrLoad->GetDst(), src1, instrLoad);

        if (!isInt)
        {
            labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            bool didTest = m_lowererMD.GenerateObjectTest(src1, instrLoad, labelDone);

            if (didTest)
            {
                // This label is needed only to mark the helper block
                IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
                instrLoad->InsertBefore(labelHelper);
            }
        }
    }

    if (!isInt)
    {
        if (labelDone)
        {
            instrLoad->InsertAfter(labelDone);
        }
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
    }
    else
    {
        instrLoad->Remove();
    }
}